

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

void __thiscall foxxll::config::initialize(config *this)

{
  Logger *pLVar1;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  Logger local_190;
  LoggerVoidify local_11;
  config *local_10;
  config *this_local;
  
  local_10 = this;
  tlx::Logger::Logger(&local_190);
  get_version_string_long_abi_cxx11_();
  pLVar1 = tlx::Logger::operator<<(&local_190,&local_1b0);
  tlx::LoggerVoidify::operator&(&local_11,pLVar1);
  std::__cxx11::string::~string((string *)&local_1b0);
  tlx::Logger::~Logger(&local_190);
  print_library_version_mismatch();
  this->first_flash = 0;
  sVar2 = std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>::size
                    (&this->disks_list);
  if (sVar2 == 0) {
    (*this->_vptr_config[2])();
  }
  this->max_device_id_ = 0;
  this->is_initialized = true;
  return;
}

Assistant:

void config::initialize()
{
    TLX_LOG1 << get_version_string_long();
    print_library_version_mismatch();

    first_flash = 0;

    // if disks_list is empty, then try to load disk configuration files
    if (disks_list.size() == 0)
    {
        find_config();
    }

    max_device_id_ = 0;

    is_initialized = true;
}